

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O2

HostFew<Omega_h::Read<signed_char>,_4> *
Omega_h::mark_dead_ents
          (HostFew<Omega_h::Read<signed_char>,_4> *__return_storage_ptr__,Mesh *mesh,
          LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  LO LVar1;
  Int IVar2;
  uint cell_dim;
  long lVar3;
  Write<signed_char> *pWVar4;
  allocator local_111;
  HostFew<Omega_h::Read<signed_char>,_4> *local_110;
  Write<signed_char> local_108;
  Write<signed_char> *local_f8;
  Write<int> *local_f0;
  Write<int> local_e8;
  Write<signed_char> local_d8;
  string local_c8;
  HostFew<Omega_h::Write<signed_char>,_4> writes;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Write<int> local_40;
  
  writes.array_[3].shared_alloc_.alloc = (Alloc *)0x0;
  writes.array_[3].shared_alloc_.direct_ptr = (void *)0x0;
  writes.array_[2].shared_alloc_.alloc = (Alloc *)0x0;
  writes.array_[2].shared_alloc_.direct_ptr = (void *)0x0;
  writes.array_[1].shared_alloc_.alloc = (Alloc *)0x0;
  writes.array_[1].shared_alloc_.direct_ptr = (void *)0x0;
  writes.array_[0].shared_alloc_.alloc = (Alloc *)0x0;
  writes.array_[0].shared_alloc_.direct_ptr = (void *)0x0;
  local_110 = __return_storage_ptr__;
  local_f8 = &rail_col_dirs->write_;
  local_f0 = &rails2edges->write_;
  Write<int>::Write(&local_e8,&rails2edges->write_);
  LVar1 = Mesh::nedges(mesh);
  mark_image((Omega_h *)&local_d8,(LOs *)&local_e8,LVar1);
  std::__cxx11::string::string((string *)&local_c8,"",&local_111);
  deep_copy<signed_char>((Omega_h *)&local_108,(Read<signed_char> *)&local_d8,&local_c8);
  Write<signed_char>::operator=(writes.array_ + 1,&local_108);
  Write<signed_char>::~Write(&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  Write<signed_char>::~Write(&local_d8);
  Write<int>::~Write(&local_e8);
  lVar3 = 2;
  pWVar4 = writes.array_ + 2;
  while( true ) {
    IVar2 = Mesh::dim(mesh);
    if (IVar2 < lVar3) break;
    LVar1 = Mesh::nents(mesh,(Int)lVar3);
    std::__cxx11::string::string((string *)&local_c8,"",&local_111);
    Write<signed_char>::Write(&local_108,LVar1,'\0',&local_c8);
    Write<signed_char>::operator=(pWVar4,&local_108);
    Write<signed_char>::~Write(&local_108);
    std::__cxx11::string::~string((string *)&local_c8);
    lVar3 = lVar3 + 1;
    pWVar4 = pWVar4 + 1;
  }
  cell_dim = Mesh::dim(mesh);
  pWVar4 = writes.array_ + cell_dim;
  for (; 1 < (int)cell_dim; cell_dim = cell_dim - 1) {
    Write<int>::Write(&local_40,local_f0);
    Write<signed_char>::Write(&local_50,local_f8);
    mark_dead_ents(mesh,(LOs *)&local_40,(Read<signed_char> *)&local_50,cell_dim,pWVar4,pWVar4 + -1)
    ;
    Write<signed_char>::~Write(&local_50);
    Write<int>::~Write(&local_40);
    pWVar4 = pWVar4 + -1;
  }
  local_110->array_[3].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_110->array_[3].write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_110->array_[2].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_110->array_[2].write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_110->array_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_110->array_[1].write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_110->array_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_110->array_[0].write_.shared_alloc_.direct_ptr = (void *)0x0;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    Write<signed_char>::Write
              (&local_60,(Write<signed_char> *)((long)&writes.array_[0].shared_alloc_.alloc + lVar3)
              );
    Read<signed_char>::Read((Read<signed_char> *)&local_c8,&local_60);
    Write<signed_char>::operator=
              ((Write<signed_char> *)
               ((long)&local_110->array_[0].write_.shared_alloc_.alloc + lVar3),
               (Write<signed_char> *)&local_c8);
    Write<signed_char>::~Write((Write<signed_char> *)&local_c8);
    Write<signed_char>::~Write(&local_60);
  }
  HostFew<Omega_h::Write<signed_char>,_4>::~HostFew(&writes);
  return local_110;
}

Assistant:

HostFew<Read<I8>, 4> mark_dead_ents(
    Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  HostFew<Write<I8>, 4> writes;
  writes[EDGE] = deep_copy(mark_image(rails2edges, mesh->nedges()));
  for (Int dim = Int(EDGE) + 1; dim <= mesh->dim(); ++dim)
    writes[dim] = Write<I8>(mesh->nents(dim), 0);
  for (Int dim = mesh->dim(); dim > EDGE; --dim)
    mark_dead_ents(
        mesh, rails2edges, rail_col_dirs, dim, writes[dim], writes[dim - 1]);
  HostFew<Read<I8>, 4> reads;
  for (Int dim = 0; dim < 4; ++dim) reads[dim] = writes[dim];
  return reads;
}